

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int32_t difference_vector16(uint16_t *A,size_t s_a,uint16_t *B,size_t s_b,uint16_t *C)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  ulong in_RCX;
  undefined1 (*in_RDX) [16];
  ulong in_RSI;
  undefined1 (*in_RDI) [16];
  undefined1 (*in_R8) [16];
  bool bVar6;
  undefined1 auVar7 [16];
  size_t i;
  uint16_t b;
  uint16_t a;
  __m128i p_1;
  __m128i sm16_1;
  int bitmask_belongs_to_difference_1;
  __m128i a_found_in_b_1;
  uint16_t buffer [8];
  __m128i p;
  __m128i sm16;
  int bitmask_belongs_to_difference;
  uint16_t b_max;
  uint16_t a_max;
  __m128i a_found_in_b;
  __m128i runningmask_a_found_in_b;
  __m128i v_b;
  __m128i v_a;
  size_t st_b;
  size_t st_a;
  size_t vectorlength;
  size_t i_b;
  size_t i_a;
  int32_t count;
  ulong local_258;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined1 local_1f8 [16];
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  uint local_1d0;
  ushort local_1cc;
  ushort local_1ca;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  ulong local_180;
  ulong local_178;
  undefined8 local_170;
  ulong local_168;
  ulong local_160;
  uint local_154;
  undefined1 (*local_150) [16];
  ulong local_148;
  undefined1 (*local_140) [16];
  ulong local_138;
  undefined1 (*local_130) [16];
  undefined8 *local_120;
  undefined1 (*local_118) [16];
  undefined1 (*local_110) [16];
  undefined1 (*local_108) [16];
  undefined1 (*local_100) [16];
  undefined1 (*local_f8) [16];
  undefined1 (*local_f0) [16];
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 *local_78;
  uint local_70;
  uint local_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  if (in_RSI == 0) {
    return 0;
  }
  local_138 = in_RSI;
  if (in_RCX == 0) {
    if (in_RDI != in_R8) {
      memcpy(in_R8,in_RDI,in_RSI << 1);
    }
    return (int32_t)local_138;
  }
  local_154 = 0;
  local_148 = in_RCX;
  local_140 = in_RDX;
  local_130 = in_RDI;
  if ((*(short *)*in_RDI == 0) || (*(short *)*in_RDX == 0)) {
    if ((*(short *)*in_RDI == 0) && (*(short *)*in_RDX == 0)) {
      local_130 = (undefined1 (*) [16])(*in_RDI + 2);
      local_138 = in_RSI - 1;
      local_140 = (undefined1 (*) [16])(*in_RDX + 2);
      local_148 = in_RCX - 1;
    }
    else {
      bVar6 = *(short *)*in_RDI != 0;
      if (bVar6) {
        local_140 = (undefined1 (*) [16])(*in_RDX + 2);
        local_148 = in_RCX - 1;
      }
      else {
        *(undefined2 *)*in_R8 = 0;
        local_130 = (undefined1 (*) [16])(*in_RDI + 2);
        local_138 = in_RSI - 1;
      }
      local_154 = (uint)!bVar6;
    }
  }
  local_160 = 0;
  local_168 = 0;
  local_170 = 8;
  local_178 = local_138 & 0xfffffffffffffff8;
  local_180 = local_148 & 0xfffffffffffffff8;
  local_150 = in_R8;
  if ((local_178 != 0) && (local_180 != 0)) {
    local_100 = local_130;
    local_198 = vlddqu_avx(*local_130);
    local_108 = local_140;
    local_1a8 = vlddqu_avx(*local_140);
    auVar7 = ZEXT816(0) << 0x20;
    local_58._8_8_ = SUB168(ZEXT816(0),4);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_58._8_8_;
    local_1b8 = auVar2 << 0x40;
LAB_00105cba:
    vpcmpistrm_avx(local_1a8,local_198,1);
    local_1c8 = local_1a8;
    auVar2 = local_1c8;
    local_1c8._0_8_ = local_1a8._0_8_;
    local_1c8._8_8_ = local_1a8._8_8_;
    local_18 = local_1b8._0_8_;
    uStack_10 = local_1b8._8_8_;
    local_28 = local_1c8._0_8_;
    uStack_20 = local_1c8._8_8_;
    local_1b8 = vpor_avx(local_1b8,local_1a8);
    local_1ca = *(ushort *)(*local_130 + local_160 * 2 + 0xe);
    local_1cc = *(ushort *)(*local_140 + local_168 * 2 + 0xe);
    if (local_1ca <= local_1cc) {
      local_1d0 = local_1b8._0_4_ ^ 0xff;
      local_f0 = (undefined1 (*) [16])(shuffle_mask16 + (long)(int)local_1d0 * 0x10);
      local_1e8 = *(undefined8 *)*local_f0;
      uStack_1e0 = *(undefined8 *)(shuffle_mask16 + (long)(int)local_1d0 * 0x10 + 8);
      local_b8 = local_198._0_8_;
      uStack_b0 = local_198._8_8_;
      local_1f8 = vpshufb_avx(local_198,*local_f0);
      local_78 = (undefined8 *)(*in_R8 + (long)(int)local_154 * 2);
      local_88 = local_1f8._0_8_;
      uStack_80 = local_1f8._8_8_;
      *local_78 = local_1f8._0_8_;
      local_78[1] = local_1f8._8_8_;
      local_154 = POPCOUNT(local_1d0) + local_154;
      uVar4 = local_160 + 8;
      uVar5 = local_168;
      local_c8 = local_1e8;
      uStack_c0 = uStack_1e0;
      local_6c = local_1d0;
      if (uVar4 == local_178) goto LAB_00105f5b;
      local_68._8_8_ = SUB168(ZEXT816(0),4);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_68._8_8_;
      local_1b8 = auVar3 << 0x40;
      local_110 = (undefined1 (*) [16])(local_130[1] + local_160 * 2);
      local_198 = vlddqu_avx(*local_110);
      local_160 = uVar4;
      local_68 = ZEXT816(0) << 0x20;
    }
    if (local_1cc <= local_1ca) {
      uVar5 = local_168 + 8;
      uVar4 = local_160;
      if (uVar5 == local_180) goto LAB_00105f5b;
      local_118 = (undefined1 (*) [16])(local_140[1] + local_168 * 2);
      local_1a8 = vlddqu_avx(*local_118);
      local_168 = uVar5;
    }
    goto LAB_00105cba;
  }
LAB_00106125:
  while (local_160 < local_138 && local_168 < local_148) {
    uVar1 = *(ushort *)(*local_130 + local_160 * 2);
    if (*(ushort *)(*local_140 + local_168 * 2) < uVar1) {
      local_168 = local_168 + 1;
    }
    else {
      if (uVar1 < *(ushort *)(*local_140 + local_168 * 2)) {
        *(ushort *)(*local_150 + (long)(int)local_154 * 2) = uVar1;
        local_154 = local_154 + 1;
      }
      else {
        local_168 = local_168 + 1;
      }
      local_160 = local_160 + 1;
    }
  }
  if (local_160 < local_138) {
    if (local_150 == local_130) {
      if ((ulong)(long)(int)local_154 < local_160) {
        memmove(*local_150 + (long)(int)local_154 * 2,*local_130 + local_160 * 2,
                (local_138 - local_160) * 2);
      }
    }
    else {
      for (local_258 = 0; local_258 < local_138 - local_160; local_258 = local_258 + 1) {
        *(undefined2 *)(*local_150 + ((long)(int)local_154 + local_258) * 2) =
             *(undefined2 *)(*local_130 + (local_258 + local_160) * 2);
      }
    }
    local_154 = ((int)local_138 - (int)local_160) + local_154;
  }
  return local_154;
LAB_00105f5b:
  local_160 = uVar4;
  local_168 = uVar5;
  local_58 = auVar7;
  local_1c8 = auVar2;
  if (local_160 < local_178) {
    local_208 = 0;
    uStack_200 = 0;
    memcpy(&local_208,*local_140 + local_168 * 2,(local_148 - local_168) * 2);
    auVar7._8_8_ = uStack_200;
    auVar7._0_8_ = local_208;
    local_1a8 = vlddqu_avx(auVar7);
    vpcmpistrm_avx(local_1a8,local_198,1);
    local_218 = local_1a8._0_8_;
    uStack_210 = local_1a8._8_8_;
    local_38 = local_1b8._0_8_;
    uStack_30 = local_1b8._8_8_;
    local_48 = local_218;
    uStack_40 = uStack_210;
    local_1b8 = vpor_avx(local_1b8,local_1a8);
    local_70 = local_1b8._0_4_ ^ 0xff;
    local_f8 = (undefined1 (*) [16])(shuffle_mask16 + (long)(int)local_70 * 0x10);
    local_e8 = *(undefined8 *)*local_f8;
    uStack_e0 = *(undefined8 *)(shuffle_mask16 + (long)(int)local_70 * 0x10 + 8);
    local_d8 = local_198._0_8_;
    uStack_d0 = local_198._8_8_;
    auVar2 = vpshufb_avx(local_198,*local_f8);
    local_90 = (undefined8 *)(*local_150 + (long)(int)local_154 * 2);
    local_248 = auVar2._0_8_;
    uStack_240 = auVar2._8_8_;
    local_a8 = local_248;
    uStack_a0 = uStack_240;
    *local_90 = local_248;
    local_90[1] = uStack_240;
    local_154 = POPCOUNT(local_70) + local_154;
    local_160 = local_160 + 8;
    local_120 = &local_208;
  }
  goto LAB_00106125;
}

Assistant:

int32_t difference_vector16(const uint16_t *__restrict__ A, size_t s_a,
                            const uint16_t *__restrict__ B, size_t s_b,
                            uint16_t *C) {
    // we handle the degenerate case
    if (s_a == 0) return 0;
    if (s_b == 0) {
        if (A != C) memcpy(C, A, sizeof(uint16_t) * s_a);
        return (int32_t)s_a;
    }
    // handle the leading zeroes, it is messy but it allows us to use the fast
    // _mm_cmpistrm instrinsic safely
    int32_t count = 0;
    if ((A[0] == 0) || (B[0] == 0)) {
        if ((A[0] == 0) && (B[0] == 0)) {
            A++;
            s_a--;
            B++;
            s_b--;
        } else if (A[0] == 0) {
            C[count++] = 0;
            A++;
            s_a--;
        } else {
            B++;
            s_b--;
        }
    }
    // at this point, we have two non-empty arrays, made of non-zero
    // increasing values.
    size_t i_a = 0, i_b = 0;
    const size_t vectorlength = sizeof(__m128i) / sizeof(uint16_t);
    const size_t st_a = (s_a / vectorlength) * vectorlength;
    const size_t st_b = (s_b / vectorlength) * vectorlength;
    if ((i_a < st_a) && (i_b < st_b)) {  // this is the vectorized code path
        __m128i v_a, v_b;                //, v_bmax;
        // we load a vector from A and a vector from B
        v_a = _mm_lddqu_si128((__m128i *)&A[i_a]);
        v_b = _mm_lddqu_si128((__m128i *)&B[i_b]);
        // we have a runningmask which indicates which values from A have been
        // spotted in B, these don't get written out.
        __m128i runningmask_a_found_in_b = _mm_setzero_si128();
        /****
         * start of the main vectorized loop
         *****/
        while (true) {
            // afoundinb will contain a mask indicate for each entry in A
            // whether it is seen
            // in B
            const __m128i a_found_in_b = _mm_cmpistrm(
                v_b, v_a,
                _SIDD_UWORD_OPS | _SIDD_CMP_EQUAL_ANY | _SIDD_BIT_MASK);
            runningmask_a_found_in_b =
                _mm_or_si128(runningmask_a_found_in_b, a_found_in_b);
            // we always compare the last values of A and B
            const uint16_t a_max = A[i_a + vectorlength - 1];
            const uint16_t b_max = B[i_b + vectorlength - 1];
            if (a_max <= b_max) {
                // Ok. In this code path, we are ready to write our v_a
                // because there is no need to read more from B, they will
                // all be large values.
                const int bitmask_belongs_to_difference =
                    _mm_extract_epi32(runningmask_a_found_in_b, 0) ^ 0xFF;
                /*** next few lines are probably expensive *****/
                __m128i sm16 = _mm_loadu_si128((const __m128i *)shuffle_mask16 +
                                               bitmask_belongs_to_difference);
                __m128i p = _mm_shuffle_epi8(v_a, sm16);
                _mm_storeu_si128((__m128i *)&C[count], p);  // can overflow
                count += _mm_popcnt_u32(bitmask_belongs_to_difference);
                // we advance a
                i_a += vectorlength;
                if (i_a == st_a)  // no more
                    break;
                runningmask_a_found_in_b = _mm_setzero_si128();
                v_a = _mm_lddqu_si128((__m128i *)&A[i_a]);
            }
            if (b_max <= a_max) {
                // in this code path, the current v_b has become useless
                i_b += vectorlength;
                if (i_b == st_b) break;
                v_b = _mm_lddqu_si128((__m128i *)&B[i_b]);
            }
        }
        // at this point, either we have i_a == st_a, which is the end of the
        // vectorized processing,
        // or we have i_b == st_b,  and we are not done processing the vector...
        // so we need to finish it off.
        if (i_a < st_a) {        // we have unfinished business...
            uint16_t buffer[8];  // buffer to do a masked load
            memset(buffer, 0, 8 * sizeof(uint16_t));
            memcpy(buffer, B + i_b, (s_b - i_b) * sizeof(uint16_t));
            v_b = _mm_lddqu_si128((__m128i *)buffer);
            const __m128i a_found_in_b = _mm_cmpistrm(
                v_b, v_a,
                _SIDD_UWORD_OPS | _SIDD_CMP_EQUAL_ANY | _SIDD_BIT_MASK);
            runningmask_a_found_in_b =
                _mm_or_si128(runningmask_a_found_in_b, a_found_in_b);
            const int bitmask_belongs_to_difference =
                _mm_extract_epi32(runningmask_a_found_in_b, 0) ^ 0xFF;
            __m128i sm16 = _mm_loadu_si128((const __m128i *)shuffle_mask16 +
                                           bitmask_belongs_to_difference);
            __m128i p = _mm_shuffle_epi8(v_a, sm16);
            _mm_storeu_si128((__m128i *)&C[count], p);  // can overflow
            count += _mm_popcnt_u32(bitmask_belongs_to_difference);
            i_a += vectorlength;
        }
        // at this point we should have i_a == st_a and i_b == st_b
    }
    // do the tail using scalar code
    while (i_a < s_a && i_b < s_b) {
        uint16_t a = A[i_a];
        uint16_t b = B[i_b];
        if (b < a) {
            i_b++;
        } else if (a < b) {
            C[count] = a;
            count++;
            i_a++;
        } else {  //==
            i_a++;
            i_b++;
        }
    }
    if (i_a < s_a) {
        if (C == A) {
            assert((size_t)count <= i_a);
            if ((size_t)count < i_a) {
                memmove(C + count, A + i_a, sizeof(uint16_t) * (s_a - i_a));
            }
        } else {
            for (size_t i = 0; i < (s_a - i_a); i++) {
                C[count + i] = A[i + i_a];
            }
        }
        count += (int32_t)(s_a - i_a);
    }
    return count;
}